

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O2

int jas_stream_display(jas_stream_t *stream,FILE *fp,int n)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  ushort **ppuVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uchar buf [16];
  
  bVar2 = true;
  uVar8 = 0;
  do {
    iVar6 = n - uVar8;
    if (iVar6 == 0 || n < (int)uVar8) {
      return 0;
    }
    bVar3 = n - n % 0x10 <= (int)uVar8;
    if (uVar8 == 0) {
      bVar3 = bVar2;
    }
    if (0x10 < n) {
      bVar2 = bVar3;
    }
    if (bVar2) {
      fprintf((FILE *)fp,"%08x:",(ulong)uVar8);
    }
    if (0xf < iVar6) {
      iVar6 = 0x10;
    }
    lVar7 = (long)iVar6;
    for (lVar9 = 0; lVar9 < lVar7; lVar9 = lVar9 + 1) {
      if ((stream->flags_ & 7U) != 0) {
LAB_00113fbd:
        abort();
      }
      if ((-1 < stream->rwlimit_) && (stream->rwlimit_ <= stream->rwcnt_)) {
        stream->flags_ = stream->flags_ | 4;
        goto LAB_00113fbd;
      }
      iVar6 = stream->cnt_;
      stream->cnt_ = iVar6 + -1;
      if (iVar6 < 1) {
        uVar4 = jas_stream_fillbuf(stream,1);
        if (uVar4 == 0xffffffff) goto LAB_00113fbd;
      }
      else {
        stream->rwcnt_ = stream->rwcnt_ + 1;
        pbVar1 = stream->ptr_;
        stream->ptr_ = pbVar1 + 1;
        uVar4 = (uint)*pbVar1;
      }
      buf[lVar9] = (uchar)uVar4;
    }
    if (bVar2) {
      for (uVar10 = 0; (long)uVar10 < lVar7; uVar10 = uVar10 + 1) {
        fprintf((FILE *)fp," %02x",(ulong)buf[uVar10]);
      }
      fputc(0x20,(FILE *)fp);
      for (; (uint)uVar10 < 0x10; uVar10 = (ulong)((uint)uVar10 + 1)) {
        fwrite("   ",3,1,(FILE *)fp);
      }
      for (lVar9 = 0; lVar9 < lVar7; lVar9 = lVar9 + 1) {
        ppuVar5 = __ctype_b_loc();
        uVar4 = 0x20;
        if (((*ppuVar5)[buf[lVar9]] >> 0xe & 1) != 0) {
          uVar4 = (uint)buf[lVar9];
        }
        fputc(uVar4,(FILE *)fp);
      }
      fputc(10,(FILE *)fp);
    }
    uVar8 = uVar8 + 0x10;
  } while( true );
}

Assistant:

int jas_stream_display(jas_stream_t *stream, FILE *fp, int n)
{
	unsigned char buf[16];
	int i;
	int j;
	int m;
	int c;
	int display;
	int cnt;

	cnt = n - (n % 16);
	display = 1;

	for (i = 0; i < n; i += 16) {
		if (n > 16 && i > 0) {
			display = (i >= cnt) ? 1 : 0;
		}
		if (display) {
			fprintf(fp, "%08x:", i);
		}
		m = JAS_MIN(n - i, 16);
		for (j = 0; j < m; ++j) {
			if ((c = jas_stream_getc(stream)) == EOF) {
				abort();
				return -1;
			}
			buf[j] = c;
		}
		if (display) {
			for (j = 0; j < m; ++j) {
				fprintf(fp, " %02x", buf[j]);
			}
			fputc(' ', fp);
			for (; j < 16; ++j) {
				fprintf(fp, "   ");
			}
			for (j = 0; j < m; ++j) {
				if (isprint(buf[j])) {
					fputc(buf[j], fp);
				} else {
					fputc(' ', fp);
				}
			}
			fprintf(fp, "\n");
		}


	}
	return 0;
}